

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O2

ON__UINT16 __thiscall
ON_Outline::Internal_AppendFigure
          (ON_Outline *this,size_t point_count_as_size_t,ON_OutlineFigurePoint *points,
          double short_tolerance,bool bSkipPointFigures)

{
  Proximity PVar1;
  ON__UINT16 OVar2;
  float fVar3;
  bool bVar4;
  Type TVar5;
  bool bVar6;
  Type TVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ON_OutlineFigure *pOVar11;
  ulong uVar12;
  ON_OutlineFigurePoint *pOVar13;
  uint uVar14;
  char *sFormat;
  ON_OutlineFigurePoint *pOVar15;
  long lVar16;
  ulong uVar17;
  uint i;
  ulong uVar18;
  ON_OutlineFigurePoint *pOVar19;
  ulong local_b0;
  ON_OutlineFigurePoint figure_start;
  ulong local_98;
  ON_OutlineFigurePoint figure_end;
  ON_OutlineFigurePoint prev_figure_end;
  ON_OutlineFigurePoint prev_figure_start;
  
  if (point_count_as_size_t == 0) {
    return 0;
  }
  uVar14 = (uint)point_count_as_size_t;
  if (uVar14 < 2 || points == (ON_OutlineFigurePoint *)0x0) {
    sFormat = "Invalid point_count or points[] array.";
    iVar9 = 0x59c;
LAB_004aeaa4:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
               ,iVar9,"",sFormat);
    return 0;
  }
  figure_start.m_point.y = (points->m_point).y;
  figure_start.m_point_type = points->m_point_type;
  figure_start.m_point_proximity = points->m_point_proximity;
  figure_start.m_figure_index = points->m_figure_index;
  figure_start.m_point.x = (points->m_point).x;
  bVar4 = ON_OutlineFigurePoint::IsBeginFigurePoint(&figure_start);
  if (((!bVar4) || (bVar4 = ON_OutlineFigurePoint::IsOnFigure(&figure_start), !bVar4)) ||
     (bVar4 = ON_2fPoint::IsValid(&figure_start.m_point), !bVar4)) {
    sFormat = "points[0] is not a valid BeginFigure point.";
    iVar9 = 0x5a7;
    goto LAB_004aeaa4;
  }
  uVar12 = (ulong)(uVar14 - 1);
  figure_end.m_point.y = points[uVar12].m_point.y;
  pOVar15 = points + uVar12;
  figure_end.m_point_type = pOVar15->m_point_type;
  figure_end.m_point_proximity = pOVar15->m_point_proximity;
  figure_end.m_figure_index = pOVar15->m_figure_index;
  figure_end.m_point.x = (pOVar15->m_point).x;
  bVar4 = ON_OutlineFigurePoint::IsEndFigurePoint(&figure_end);
  if (((!bVar4) || (bVar4 = ON_OutlineFigurePoint::IsOnFigure(&figure_end), !bVar4)) ||
     (bVar4 = ON_2fPoint::IsValid(&figure_end.m_point), !bVar4)) {
    sFormat = "points[point_count-1] is not a valid EndFigure point.";
    iVar9 = 0x5b2;
    goto LAB_004aeaa4;
  }
  if ((bSkipPointFigures && uVar14 == 2) &&
     (bVar4 = ON_2fPoint::operator==(&figure_start.m_point,&figure_end.m_point), bVar4)) {
    return 0;
  }
  bVar4 = false;
  if ((2 < uVar14) && (this->m_figure_type == DoubleStroke)) {
    TVar5 = ON_OutlineFigurePoint::PointType(&figure_start);
    if ((TVar5 == BeginFigureClosed) &&
       (TVar5 = ON_OutlineFigurePoint::PointType(&figure_end), TVar5 == EndFigureClosed)) {
      bVar4 = ON_2fPoint::operator==(&figure_start.m_point,&figure_end.m_point);
      if (3 < uVar14 && bVar4) {
        iVar9 = (this->m_figures).m_count;
        bVar4 = true;
        if (iVar9 != 0) {
          uVar8 = iVar9 - 1;
          pOVar11 = (this->m_figures).m_a;
          if (pOVar11[uVar8].m_figure_type == DoubleStroke) {
            if (pOVar11[uVar8].m_points.m_count == uVar14) {
              pOVar15 = pOVar11[uVar8].m_points.m_a;
              prev_figure_start.m_point.y = (pOVar15->m_point).y;
              prev_figure_start.m_point_type = pOVar15->m_point_type;
              prev_figure_start.m_point_proximity = pOVar15->m_point_proximity;
              prev_figure_start.m_figure_index = pOVar15->m_figure_index;
              prev_figure_start.m_point.x = (pOVar15->m_point).x;
              pOVar15 = pOVar11[uVar8].m_points.m_a;
              prev_figure_end.m_point.y = pOVar15[uVar12].m_point.y;
              pOVar15 = pOVar15 + uVar12;
              prev_figure_end.m_point_type = pOVar15->m_point_type;
              prev_figure_end.m_point_proximity = pOVar15->m_point_proximity;
              prev_figure_end.m_figure_index = pOVar15->m_figure_index;
              prev_figure_end.m_point.x = (pOVar15->m_point).x;
              TVar5 = ON_OutlineFigurePoint::PointType(&prev_figure_start);
              if ((((TVar5 == BeginFigureClosed) &&
                   (TVar5 = ON_OutlineFigurePoint::PointType(&prev_figure_end),
                   TVar5 == EndFigureClosed)) &&
                  (bVar4 = ON_2fPoint::operator==(&prev_figure_start.m_point,&figure_start.m_point),
                  bVar4)) &&
                 (bVar4 = ON_2fPoint::operator==(&prev_figure_end.m_point,&figure_start.m_point),
                 bVar4)) {
                for (iVar9 = 0; iVar9 != 2; iVar9 = iVar9 + 1) {
                  uVar18 = 0;
                  pOVar15 = points;
                  lVar16 = point_count_as_size_t - 1;
                  do {
                    if ((point_count_as_size_t & 0xffffffff) == uVar18) {
                      pOVar15 = pOVar11[uVar8].m_points.m_a;
                      pOVar15->m_point_type = BeginFigureOpen;
                      bVar4 = ON_OutlineFigurePoint::IsOnFigure(pOVar15 + (uVar14 - 2));
                      if ((bVar4) &&
                         (bVar4 = ON_2fPoint::operator==
                                            (&prev_figure_end.m_point,
                                             &pOVar11[uVar8].m_points.m_a[uVar14 - 2].m_point),
                         !bVar4)) {
                        pOVar13 = ON_SimpleArray<ON_OutlineFigurePoint>::AppendNew
                                            (&pOVar11[uVar8].m_points);
                        uVar14 = pOVar11[uVar8].m_points.m_count - 2;
                        pOVar19 = pOVar11[uVar8].m_points.m_a;
                        pOVar19[uVar14].m_point_type = LineTo;
                        pOVar15 = pOVar19 + uVar14;
                        PVar1 = pOVar15->m_point_proximity;
                        OVar2 = pOVar15->m_figure_index;
                        fVar3 = (pOVar15->m_point).x;
                        pOVar13->m_point_type = pOVar15->m_point_type;
                        pOVar13->m_point_proximity = PVar1;
                        pOVar13->m_figure_index = OVar2;
                        (pOVar13->m_point).x = fVar3;
                        (pOVar13->m_point).y = pOVar19[uVar14].m_point.y;
                        pOVar13->m_point_type = EndFigureOpen;
                      }
                      pOVar11[uVar8].m_figure_type = SingleStroke;
                      return pOVar11[uVar8].m_figure_index;
                    }
                    uVar10 = (uint)lVar16;
                    if (iVar9 == 0) {
                      uVar10 = (uint)uVar18;
                    }
                    pOVar19 = pOVar11[uVar8].m_points.m_a + uVar10;
                    bVar4 = ON_OutlineFigurePoint::IsOnFigure(pOVar19);
                    bVar6 = ON_OutlineFigurePoint::IsOnFigure(pOVar15);
                    if (bVar4 != bVar6) {
                      TVar5 = ON_OutlineFigurePoint::PointType(pOVar19);
                      TVar7 = ON_OutlineFigurePoint::PointType(pOVar15);
                      if (TVar5 != TVar7) break;
                    }
                    bVar4 = ON_2fPoint::operator==(&pOVar19->m_point,&pOVar15->m_point);
                    uVar18 = uVar18 + 1;
                    lVar16 = lVar16 + -1;
                    pOVar15 = pOVar15 + 1;
                  } while (bVar4);
                }
              }
            }
            bVar4 = true;
          }
        }
      }
    }
    else {
      bVar4 = false;
    }
  }
  pOVar11 = ON_ClassArray<ON_OutlineFigure>::AppendNew(&this->m_figures);
  pOVar11->m_figure_index = (ON__UINT16)(this->m_figures).m_count;
  pOVar11->m_short_tolerance =
       (double)(~-(ulong)(0.0 < short_tolerance) & (ulong)this->m_short_tolerance |
               (ulong)short_tolerance & -(ulong)(0.0 < short_tolerance));
  ON_SimpleArray<ON_OutlineFigurePoint>::Append(&pOVar11->m_points,uVar14,points);
  pOVar15 = (pOVar11->m_points).m_a;
  (pOVar15->m_point).y = figure_start.m_point.y;
  pOVar15->m_point_type = figure_start.m_point_type;
  pOVar15->m_point_proximity = figure_start.m_point_proximity;
  pOVar15->m_figure_index = figure_start.m_figure_index;
  (pOVar15->m_point).x = figure_start.m_point.x;
  pOVar11->m_figure_type = this->m_figure_type;
  pOVar11->m_units_per_em = this->m_units_per_em;
  if (bVar4 == false) goto LAB_004af07d;
  prev_figure_start._0_8_ = ON_2fPoint::NanPoint;
  uVar8 = uVar14 - 3;
  if (uVar8 == 0) {
    bVar4 = false;
    uVar12 = 2;
  }
  else {
    bVar4 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + uVar8);
    if (!bVar4) {
      uVar18 = (ulong)(uVar14 - 2);
      bVar4 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + uVar18);
      if ((bVar4) &&
         (bVar4 = ON_2fPoint::operator==
                            (&(pOVar11->m_points).m_a[uVar18].m_point,&figure_end.m_point), bVar4))
      {
        bVar4 = false;
        uVar12 = uVar18;
        goto LAB_004aee4a;
      }
    }
    bVar4 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + uVar8);
    if ((bVar4) &&
       (bVar4 = ON_2fPoint::operator==
                          (&(pOVar11->m_points).m_a[uVar8].m_point,&figure_start.m_point), bVar4)) {
      uVar10 = uVar14 - 2;
      bVar4 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + uVar10);
      if ((bVar4) &&
         (TVar5 = ON_OutlineFigurePoint::PointType((pOVar11->m_points).m_a + uVar10),
         TVar5 == LineTo)) {
        prev_figure_start._0_8_ = (pOVar11->m_points).m_a[uVar10].m_point;
        bVar4 = ON_2fPoint::operator==((ON_2fPoint *)&prev_figure_start,&figure_end.m_point);
        bVar4 = !bVar4;
        uVar12 = (ulong)uVar8;
        goto LAB_004aee4a;
      }
    }
    bVar4 = false;
  }
LAB_004aee4a:
  if ((uVar12 & 1) == 0 && (int)uVar12 != 0) {
    local_98 = 0;
LAB_004aee65:
    local_b0 = local_98 & 0xffffffff;
    if ((uint)local_98 < (uint)uVar12) {
      pOVar15 = (pOVar11->m_points).m_a;
      lVar16 = local_b0 * 0xc;
      bVar6 = ON_2fPoint::operator==(&pOVar15[local_b0].m_point,&pOVar15[uVar12].m_point);
      if (((!bVar6) ||
          (bVar6 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + local_b0), !bVar6))
         || (bVar6 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + uVar12),
            uVar18 = uVar12, !bVar6)) goto LAB_004aef76;
      while( true ) {
        uVar18 = uVar18 - 1;
        local_b0 = local_b0 + 1;
        uVar12 = uVar18 & 0xffffffff;
        uVar17 = uVar18 & 0xffffffff;
        local_98 = local_b0;
        if (((uVar17 <= local_b0) ||
            (bVar6 = ON_OutlineFigurePoint::IsOnFigure
                               ((ON_OutlineFigurePoint *)
                                (&(pOVar11->m_points).m_a[1].m_point_type + lVar16)), bVar6)) ||
           (bVar6 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + uVar17), bVar6))
        break;
        TVar5 = ON_OutlineFigurePoint::PointType
                          ((ON_OutlineFigurePoint *)
                           (&(pOVar11->m_points).m_a[1].m_point_type + lVar16));
        TVar7 = ON_OutlineFigurePoint::PointType((pOVar11->m_points).m_a + uVar17);
        if ((TVar5 != TVar7) ||
           (pOVar15 = (pOVar11->m_points).m_a,
           bVar6 = ON_2fPoint::operator==
                             ((ON_2fPoint *)((long)&pOVar15[1].m_point.x + lVar16),
                              &pOVar15[uVar17].m_point), lVar16 = lVar16 + 0xc, !bVar6)) break;
      }
      goto LAB_004aee65;
    }
LAB_004aef76:
    if (((uint)local_98 == (uint)uVar12) &&
       (((bVar6 = ON_OutlineFigurePoint::IsOnFigure((pOVar11->m_points).m_a + local_b0), bVar6 &&
         (bVar6 = ON_OutlineFigurePoint::IsEndFigurePoint((pOVar11->m_points).m_a + local_b0),
         !bVar6)) && (uVar8 = (uint)local_98 + 2, uVar8 <= uVar14)))) {
      if (bVar4) {
        uVar8 = (uint)local_98 + 3;
        if (uVar14 < uVar8) goto LAB_004af07d;
        local_98._0_4_ = (uint)local_98 + 1;
        local_b0 = (ulong)(uint)local_98;
        for (lVar16 = local_b0 * 0xc; lVar16 != 0; lVar16 = lVar16 + -0xc) {
          pOVar15 = (pOVar11->m_points).m_a;
          *(undefined4 *)((long)&(pOVar15->m_point).y + lVar16) =
               *(undefined4 *)((long)pOVar15 + lVar16 + -4);
          *(undefined8 *)(&pOVar15->m_point_type + lVar16) =
               *(undefined8 *)(&pOVar15[-1].m_point_type + lVar16);
        }
        ((pOVar11->m_points).m_a)->m_point = (ON_2fPoint)prev_figure_start._0_8_;
        pOVar15 = (pOVar11->m_points).m_a;
        pOVar15[1].m_point_type = LineTo;
      }
      else {
        pOVar15 = (pOVar11->m_points).m_a;
      }
      pOVar15->m_point_type = BeginFigureOpen;
      pOVar15[(uint)local_98 + 1].m_point = pOVar15[local_b0].m_point;
      pOVar15 = (pOVar11->m_points).m_a + ((uint)local_98 + 1);
      pOVar15->m_point_type = EndFigureOpen;
      pOVar15->m_point_proximity = OnFigure;
      pOVar11->m_figure_type = SingleStroke;
      if ((-1 < (int)uVar8) && ((int)uVar8 <= (pOVar11->m_points).m_capacity)) {
        (pOVar11->m_points).m_count = uVar8;
      }
    }
  }
LAB_004af07d:
  this->m_sorted_figure_outer_orientation = Unset;
  return pOVar11->m_figure_index;
}

Assistant:

ON__UINT16 ON_Outline::Internal_AppendFigure(
  size_t point_count_as_size_t,
  const ON_OutlineFigurePoint* points,
  double short_tolerance,
  bool bSkipPointFigures
)
{
  if (0 == point_count_as_size_t)
    return 0;
  
  const unsigned int point_count = (unsigned int)point_count_as_size_t;

  if (point_count < 2 || nullptr == points)
  {
    ON_ERROR("Invalid point_count or points[] array.");
    return 0;
  }

  const ON_OutlineFigurePoint figure_start = points[0];
  if (
    false == figure_start.IsBeginFigurePoint()
    || false == figure_start.IsOnFigure()
    || false == figure_start.m_point.IsValid()
    )
  {
    ON_ERROR("points[0] is not a valid BeginFigure point.");
    return 0;
  }

  const ON_OutlineFigurePoint figure_end = points[point_count-1];
  if (
    false == figure_end.IsEndFigurePoint()
    || false == figure_end.IsOnFigure()
    || false == figure_end.m_point.IsValid()
    )
  {
    ON_ERROR("points[point_count-1] is not a valid EndFigure point.");
    return 0;
  }

  if (bSkipPointFigures && 2 == point_count && figure_start.m_point == figure_end.m_point)
    return 0;

  const bool bDoubleStrokeReductionTest
    = ON_OutlineFigure::Type::DoubleStroke == m_figure_type
    && point_count >= 3
    && ON_OutlineFigurePoint::Type::BeginFigureClosed == figure_start.PointType()
    && ON_OutlineFigurePoint::Type::EndFigureClosed == figure_end.PointType()
    && figure_start.m_point == figure_end.m_point;

  while (
    bDoubleStrokeReductionTest
    && point_count >= 4
    && m_figures.UnsignedCount() > 0
    )
  {
    ON_OutlineFigure& prev_figure = m_figures[m_figures.UnsignedCount() - 1];
    if (ON_OutlineFigure::Type::DoubleStroke != prev_figure.m_figure_type)
      break;
    if (point_count != (prev_figure.m_points.UnsignedCount()))
      break;
    const ON_OutlineFigurePoint prev_figure_start = prev_figure.m_points[0];
    const ON_OutlineFigurePoint prev_figure_end = prev_figure.m_points[point_count-1];
    if (ON_OutlineFigurePoint::Type::BeginFigureClosed != prev_figure_start.PointType())
      break;
    if (ON_OutlineFigurePoint::Type::EndFigureClosed != prev_figure_end.PointType())
      break;
    if (false == (prev_figure_start.m_point == figure_start.m_point) )
      break;
    if (false == (prev_figure_end.m_point == figure_start.m_point) )
      break;

    for (int dup_check_pass = 0; dup_check_pass < 2; dup_check_pass++)
    {
      bool bDuplicateLoop = true;
      for (unsigned int i = 0; i < point_count; i++)
      {
        const unsigned int j = (0 == dup_check_pass) ? i : (point_count - i - 1);
        const ON_OutlineFigurePoint& prev_point = prev_figure.m_points[j];
        bDuplicateLoop
          = (prev_point.IsOnFigure() == points[i].IsOnFigure() || prev_point.PointType() == points[i].PointType())
          && prev_point.m_point == points[i].m_point;
        if (false == bDuplicateLoop)
          break;
      }
      if (false == bDuplicateLoop)
        continue;

      // This figure is the double stroke duplicate of the previous figure (double stroke glphys like O).
      prev_figure.m_points[0].m_point_type = ON_OutlineFigurePoint::Type::BeginFigureOpen;
      if (
        prev_figure.m_points[point_count - 2].IsOnFigure()
        && false == (prev_figure_end.m_point == prev_figure.m_points[point_count - 2].m_point)
        )
      {
        ON_OutlineFigurePoint& new_figure_end = prev_figure.m_points.AppendNew();
        ON_OutlineFigurePoint& p = prev_figure.m_points[prev_figure.m_points.UnsignedCount() - 2];
        p.m_point_type = ON_OutlineFigurePoint::Type::LineTo;
        new_figure_end = p;
        new_figure_end.m_point_type = ON_OutlineFigurePoint::Type::EndFigureOpen;
      }
      prev_figure.m_figure_type = ON_OutlineFigure::Type::SingleStroke;
      return prev_figure.FigureIndex();
    }
    break;
  }
  
  ON_OutlineFigure& figure = m_figures.AppendNew();
  figure.m_figure_index = (ON__UINT16)m_figures.UnsignedCount();
  figure.m_short_tolerance = (short_tolerance>0.0) ? short_tolerance : m_short_tolerance;
  figure.m_points.Append((int)point_count, points);
  figure.m_points[0] = figure_start;
  figure.m_figure_type = m_figure_type;
  figure.m_units_per_em = this->m_units_per_em;

  while (bDoubleStrokeReductionTest)
  {
    // check for a double stroke figure like those in CamBam Stick fonts
    unsigned int i0 = 0;

    ON_2fPoint Qpoint(ON_2fPoint::NanPoint);
    bool bPrependQseg = false;
    unsigned int i1 = (unsigned int)(point_count - 1);
    if (i1 - 2 > 0)
    {
      if (
        false == figure.m_points[i1 - 2].IsOnFigure()
        && figure.m_points[i1 - 1].IsOnFigure()
        && figure.m_points[i1 - 1].m_point == figure_end.m_point
        )
      {
        i1--;
      }
      else if (
        figure.m_points[i1 - 2].IsOnFigure()
        && figure.m_points[i1 - 2].m_point == figure_start.m_point
        && figure.m_points[i1 - 1].IsOnFigure()
        && ON_OutlineFigurePoint::Type::LineTo == figure.m_points[i1 - 1].PointType()
        )
      {
        Qpoint = figure.m_points[i1 - 1].m_point;
        if (false == (Qpoint == figure_end.m_point))
          bPrependQseg = true;
        i1 -= 2;
      }
    }
   
    if (i0 >= i1)
      break;

    if (0 != (i1 - i0) % 2)
      break;

    while (i0 < i1)
    {
      if (false == (figure.m_points[i0].m_point == figure.m_points[i1].m_point))
        break;
      if (false == figure.m_points[i0].IsOnFigure() || false == figure.m_points[i1].IsOnFigure())
        break;
      i0++;
      i1--;
      while (
        i0 < i1
        && false == figure.m_points[i0].IsOnFigure()
        && false == figure.m_points[i1].IsOnFigure()
        && figure.m_points[i0].PointType() == figure.m_points[i1].PointType()
        && figure.m_points[i0].m_point == figure.m_points[i1].m_point
        )
      {
        i0++;
        i1--;
      }
    }
    if (i0 != i1)
      break;
    if (false == figure.m_points[i1].IsOnFigure())
      break;
    if (figure.m_points[i1].IsEndFigurePoint())
      break;
    if ((size_t)(i1 + 2) > point_count)
      break;

    if ( bPrependQseg )
    {
      if ((i1 + 3) > point_count)
        break;
      for (unsigned int i = i1 + 1; i > 0; i--)
        figure.m_points[i] = figure.m_points[i - 1];
      figure.m_points[0].m_point = Qpoint;
      figure.m_points[1].m_point_type = ON_OutlineFigurePoint::Type::LineTo;
      i1++;
    }
    figure.m_points[0].m_point_type = ON_OutlineFigurePoint::Type::BeginFigureOpen;
    figure.m_points[i1 + 1].m_point = figure.m_points[i1].m_point;
    figure.m_points[i1 + 1].m_point_type = ON_OutlineFigurePoint::Type::EndFigureOpen;
    figure.m_points[i1 + 1].m_point_proximity = ON_OutlineFigurePoint::Proximity::OnFigure;
    figure.m_figure_type = ON_OutlineFigure::Type::SingleStroke;
    figure.m_points.SetCount(i1 + 2);

    break;
  }

  m_sorted_figure_outer_orientation = ON_OutlineFigure::Orientation::Unset;
  return figure.m_figure_index;
}